

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::UnbasedUnsizedIntegerLiteral::evalImpl
          (UnbasedUnsizedIntegerLiteral *this,EvalContext *param_2)

{
  ConstantValue *in_RDI;
  SVInt *in_stack_ffffffffffffffa8;
  SVInt *this_00;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_stack_ffffffffffffffd8;
  
  this_00 = (SVInt *)&stack0xffffffffffffffd8;
  getValue((UnbasedUnsizedIntegerLiteral *)in_stack_ffffffffffffffd8.pVal);
  slang::ConstantValue::ConstantValue(in_RDI,in_stack_ffffffffffffffa8);
  SVInt::~SVInt(this_00);
  return in_RDI;
}

Assistant:

ConstantValue UnbasedUnsizedIntegerLiteral::evalImpl(EvalContext&) const {
    return getValue();
}